

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test::
TestBody(SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test *this)

{
  FunctionMocker<void_()> *this_00;
  int iVar1;
  WrapperMock *this_01;
  StrictMock<solitaire::SDL::WrapperMock> *mock_obj;
  bool bVar2;
  TypedExpectation<int_(unsigned_int)> *this_02;
  ActionInterface<int_(unsigned_int)> *impl;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_03;
  ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *impl_00;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  Action<int_(unsigned_int)> local_60;
  MatcherBase<unsigned_int> local_40;
  int *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_01 = &((this->super_SDLGraphicsSystemTests).sdlMock.rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_40,0x20);
  SDL::WrapperMock::gmock_init
            ((MockSpec<int_(unsigned_int)> *)local_80,this_01,(Matcher<unsigned_int> *)&local_40);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      ((MockSpec<int_(unsigned_int)> *)local_80,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x85,"*sdlMock","init(0x00000020u)");
  local_28 = (int *)operator_new(4);
  *local_28 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_20,local_28);
  impl = (ActionInterface<int_(unsigned_int)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00329638;
  iVar1 = *local_28;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(unsigned_int)>::Action(&local_60,impl);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce(this_02,&local_60);
  if ((pointer)local_60.fun_.super__Function_base._M_manager != (pointer)0x0) {
    (*local_60.fun_.super__Function_base._M_manager)(&local_60,&local_60,3);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)(local_80 + 8));
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_40);
  this_03 = SDLGraphicsSystemTests::expectSDLCreateWindow
                      (&this->super_SDLGraphicsSystemTests,
                       (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  impl_00 = (ActionInterface<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
             *)operator_new(0x10);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003296e8;
  testing::
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::Action((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
            *)local_80,impl_00);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_03,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)local_80);
  if ((VTable *)local_70._0_8_ != (VTable *)0x0) {
    (*(code *)local_70._0_8_)(local_80,local_80,3);
  }
  mock_obj = (this->super_SDLGraphicsSystemTests).sdlMock.rawPointer;
  this_00 = &(mock_obj->super_WrapperMock).gmock10_quit_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_80._0_8_ = this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x87,"*sdlMock","quit()");
  local_70._0_8_ = (VTable *)0x0;
  local_70._8_8_ = (void *)0x0;
  local_80._8_8_ = (_func_int **)0x0;
  local_80._0_8_ = (FunctionMocker<int_(unsigned_int)> *)local_70;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    SDLGraphicsSystem::createWindow
              (&(this->super_SDLGraphicsSystemTests).system,
               (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  }
  std::__cxx11::string::_M_replace((ulong)local_80,0,(char *)local_80._8_8_,0x28ae90);
  testing::Message::Message((Message *)&local_60);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x8c,(char *)local_80._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
  if ((long *)local_60.fun_.super__Function_base._M_functor._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_60.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
  }
  if ((FunctionMocker<int_(unsigned_int)> *)local_80._0_8_ !=
      (FunctionMocker<int_(unsigned_int)> *)local_70) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)(_func_bool_MatcherBase<unsigned_int>_ptr_uint_ptr_MatchResultListener_ptr
                                   **)local_70._0_8_ + 1));
  }
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemTests, throwIfSDLCreateWindowFailedDuringWindowCreation) {
    EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
    expectSDLCreateWindow(title, windowWidth, windowHeight).WillOnce(ReturnNull());
    EXPECT_CALL(*sdlMock, quit());

    EXPECT_THROW(
        system.createWindow(title, windowWidth, windowHeight),
        std::runtime_error
    );
}